

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  byte bVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  ulong uVar40;
  size_t sVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 local_1548 [16];
  long local_1530;
  undefined1 (*local_1528) [16];
  long local_1520;
  RTCFilterFunctionNArguments args;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  pNVar39 = stack + 1;
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar76 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar83 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar85 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1258 = local_12b8 * 0.99999964;
  local_1278 = local_12d8 * 0.99999964;
  local_1298 = local_12f8 * 0.99999964;
  local_12b8 = local_12b8 * 1.0000004;
  local_12d8 = local_12d8 * 1.0000004;
  local_12f8 = local_12f8 * 1.0000004;
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar2 = (tray->tnear).field_0.i[k];
  auVar98 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  iVar2 = (tray->tfar).field_0.i[k];
  auVar99 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_1528 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar44 = true;
  fStack_1254 = local_1258;
  fStack_1250 = local_1258;
  fStack_124c = local_1258;
  fStack_1248 = local_1258;
  fStack_1244 = local_1258;
  fStack_1240 = local_1258;
  fStack_123c = local_1258;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  fStack_12f4 = local_12f8;
  fStack_12f0 = local_12f8;
  fStack_12ec = local_12f8;
  fStack_12e8 = local_12f8;
  fStack_12e4 = local_12f8;
  fStack_12e0 = local_12f8;
  fStack_12dc = local_12f8;
  do {
    sVar41 = pNVar39[-1].ptr;
    pNVar39 = pNVar39 + -1;
    while( true ) {
      local_11f8 = auVar76._0_32_;
      local_1218 = auVar83._0_32_;
      local_1238 = auVar85._0_32_;
      if ((sVar41 & 8) != 0) break;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar50._4_4_ = uVar1;
      auVar50._0_4_ = uVar1;
      auVar50._8_4_ = uVar1;
      auVar50._12_4_ = uVar1;
      auVar50._16_4_ = uVar1;
      auVar50._20_4_ = uVar1;
      auVar50._24_4_ = uVar1;
      auVar50._28_4_ = uVar1;
      uVar33 = sVar41 & 0xfffffffffffffff0;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar40),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar40));
      auVar24 = vsubps_avx(ZEXT1632(auVar45),local_11f8);
      auVar25._4_4_ = fStack_1254 * auVar24._4_4_;
      auVar25._0_4_ = local_1258 * auVar24._0_4_;
      auVar25._8_4_ = fStack_1250 * auVar24._8_4_;
      auVar25._12_4_ = fStack_124c * auVar24._12_4_;
      auVar25._16_4_ = fStack_1248 * auVar24._16_4_;
      auVar25._20_4_ = fStack_1244 * auVar24._20_4_;
      auVar25._24_4_ = fStack_1240 * auVar24._24_4_;
      auVar25._28_4_ = auVar24._28_4_;
      auVar24 = vmaxps_avx(auVar98._0_32_,auVar25);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar35),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar35));
      auVar25 = vsubps_avx(ZEXT1632(auVar45),local_1218);
      auVar26._4_4_ = fStack_1274 * auVar25._4_4_;
      auVar26._0_4_ = local_1278 * auVar25._0_4_;
      auVar26._8_4_ = fStack_1270 * auVar25._8_4_;
      auVar26._12_4_ = fStack_126c * auVar25._12_4_;
      auVar26._16_4_ = fStack_1268 * auVar25._16_4_;
      auVar26._20_4_ = fStack_1264 * auVar25._20_4_;
      auVar26._24_4_ = fStack_1260 * auVar25._24_4_;
      auVar26._28_4_ = auVar25._28_4_;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar42),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar42));
      auVar25 = vsubps_avx(ZEXT1632(auVar45),local_1238);
      auVar29._4_4_ = fStack_1294 * auVar25._4_4_;
      auVar29._0_4_ = local_1298 * auVar25._0_4_;
      auVar29._8_4_ = fStack_1290 * auVar25._8_4_;
      auVar29._12_4_ = fStack_128c * auVar25._12_4_;
      auVar29._16_4_ = fStack_1288 * auVar25._16_4_;
      auVar29._20_4_ = fStack_1284 * auVar25._20_4_;
      auVar29._24_4_ = fStack_1280 * auVar25._24_4_;
      auVar29._28_4_ = auVar25._28_4_;
      auVar25 = vmaxps_avx(auVar26,auVar29);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + (uVar40 ^ 0x20)),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + (uVar40 ^ 0x20)));
      auVar25 = vsubps_avx(ZEXT1632(auVar45),local_11f8);
      auVar30._4_4_ = fStack_12b4 * auVar25._4_4_;
      auVar30._0_4_ = local_12b8 * auVar25._0_4_;
      auVar30._8_4_ = fStack_12b0 * auVar25._8_4_;
      auVar30._12_4_ = fStack_12ac * auVar25._12_4_;
      auVar30._16_4_ = fStack_12a8 * auVar25._16_4_;
      auVar30._20_4_ = fStack_12a4 * auVar25._20_4_;
      auVar30._24_4_ = fStack_12a0 * auVar25._24_4_;
      auVar30._28_4_ = auVar25._28_4_;
      auVar25 = vminps_avx(auVar99._0_32_,auVar30);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + (uVar35 ^ 0x20)),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + (uVar35 ^ 0x20)));
      auVar26 = vsubps_avx(ZEXT1632(auVar45),local_1218);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + (uVar42 ^ 0x20)),auVar50,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + (uVar42 ^ 0x20)));
      auVar31._4_4_ = fStack_12d4 * auVar26._4_4_;
      auVar31._0_4_ = local_12d8 * auVar26._0_4_;
      auVar31._8_4_ = fStack_12d0 * auVar26._8_4_;
      auVar31._12_4_ = fStack_12cc * auVar26._12_4_;
      auVar31._16_4_ = fStack_12c8 * auVar26._16_4_;
      auVar31._20_4_ = fStack_12c4 * auVar26._20_4_;
      auVar31._24_4_ = fStack_12c0 * auVar26._24_4_;
      auVar31._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(ZEXT1632(auVar45),local_1238);
      auVar32._4_4_ = fStack_12f4 * auVar26._4_4_;
      auVar32._0_4_ = local_12f8 * auVar26._0_4_;
      auVar32._8_4_ = fStack_12f0 * auVar26._8_4_;
      auVar32._12_4_ = fStack_12ec * auVar26._12_4_;
      auVar32._16_4_ = fStack_12e8 * auVar26._16_4_;
      auVar32._20_4_ = fStack_12e4 * auVar26._20_4_;
      auVar32._24_4_ = fStack_12e0 * auVar26._24_4_;
      auVar32._28_4_ = auVar26._28_4_;
      auVar26 = vminps_avx(auVar31,auVar32);
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar24 = vcmpps_avx(auVar24,auVar25,2);
      if (((uint)sVar41 & 7) == 6) {
        auVar25 = vcmpps_avx(*(undefined1 (*) [32])(uVar33 + 0x1c0),auVar50,2);
        auVar26 = vcmpps_avx(auVar50,*(undefined1 (*) [32])(uVar33 + 0x1e0),1);
        auVar25 = vandps_avx(auVar25,auVar26);
        auVar24 = vandps_avx(auVar25,auVar24);
        auVar45 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      }
      else {
        auVar45 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      }
      auVar45 = vpsllw_avx(auVar45,0xf);
      if ((((((((auVar45 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar45 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar45 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar45 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar45[0xf])
      goto LAB_005d1683;
      auVar45 = vpacksswb_avx(auVar45,auVar45);
      bVar27 = SUB161(auVar45 >> 7,0) & 1 | (SUB161(auVar45 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar45 >> 0x17,0) & 1) << 2 | (SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar45 >> 0x27,0) & 1) << 4 | (SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar45 >> 0x37,0) & 1) << 6 | SUB161(auVar45 >> 0x3f,0) << 7;
      lVar34 = 0;
      for (uVar36 = (ulong)bVar27; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      sVar41 = *(size_t *)(uVar33 + lVar34 * 8);
      uVar37 = bVar27 - 1 & (uint)bVar27;
      uVar36 = (ulong)uVar37;
      if (uVar37 != 0) {
        pNVar39->ptr = sVar41;
        lVar34 = 0;
        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar37 = uVar37 - 1 & uVar37;
        uVar36 = (ulong)uVar37;
        bVar43 = uVar37 == 0;
        while( true ) {
          pNVar39 = pNVar39 + 1;
          sVar41 = *(size_t *)(uVar33 + lVar34 * 8);
          if (bVar43) break;
          pNVar39->ptr = sVar41;
          lVar34 = 0;
          for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          bVar43 = uVar36 == 0;
        }
      }
    }
    local_1520 = (ulong)((uint)sVar41 & 0xf) - 8;
    if (local_1520 != 0) {
      uVar33 = sVar41 & 0xfffffffffffffff0;
      local_1530 = 0;
      local_1318 = auVar98._0_32_;
      local_1338 = auVar99._0_32_;
      do {
        lVar34 = local_1530 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar65._4_4_ = uVar1;
        auVar65._0_4_ = uVar1;
        auVar65._8_4_ = uVar1;
        auVar65._12_4_ = uVar1;
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + lVar34));
        auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xa0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x10 + lVar34));
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x20 + lVar34));
        auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x30 + lVar34));
        auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x40 + lVar34));
        auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xe0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x50 + lVar34));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xf0 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x60 + lVar34));
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x100 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x70 + lVar34));
        auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x110 + lVar34),auVar65,
                                  *(undefined1 (*) [16])(uVar33 + 0x80 + lVar34));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar66._4_4_ = uVar1;
        auVar66._0_4_ = uVar1;
        auVar66._8_4_ = uVar1;
        auVar66._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar94._4_4_ = uVar1;
        auVar94._0_4_ = uVar1;
        auVar94._8_4_ = uVar1;
        auVar94._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar96._4_4_ = uVar1;
        auVar96._0_4_ = uVar1;
        auVar96._8_4_ = uVar1;
        auVar96._12_4_ = uVar1;
        auVar65 = vsubps_avx(auVar45,auVar66);
        auVar82 = vsubps_avx(auVar78,auVar94);
        auVar45 = vsubps_avx(auVar58,auVar96);
        auVar78 = vsubps_avx(auVar52,auVar66);
        auVar58 = vsubps_avx(auVar70,auVar94);
        auVar52 = vsubps_avx(auVar71,auVar96);
        auVar70 = vsubps_avx(auVar59,auVar66);
        auVar71 = vsubps_avx(auVar75,auVar94);
        auVar59 = vsubps_avx(auVar91,auVar96);
        auVar75 = vsubps_avx(auVar70,auVar65);
        auVar91 = vsubps_avx(auVar71,auVar82);
        auVar66 = vsubps_avx(auVar59,auVar45);
        auVar46._0_4_ = auVar70._0_4_ + auVar65._0_4_;
        auVar46._4_4_ = auVar70._4_4_ + auVar65._4_4_;
        auVar46._8_4_ = auVar70._8_4_ + auVar65._8_4_;
        auVar46._12_4_ = auVar70._12_4_ + auVar65._12_4_;
        auVar62._0_4_ = auVar71._0_4_ + auVar82._0_4_;
        auVar62._4_4_ = auVar71._4_4_ + auVar82._4_4_;
        auVar62._8_4_ = auVar71._8_4_ + auVar82._8_4_;
        auVar62._12_4_ = auVar71._12_4_ + auVar82._12_4_;
        fVar8 = auVar45._0_4_;
        auVar67._0_4_ = auVar59._0_4_ + fVar8;
        fVar9 = auVar45._4_4_;
        auVar67._4_4_ = auVar59._4_4_ + fVar9;
        fVar10 = auVar45._8_4_;
        auVar67._8_4_ = auVar59._8_4_ + fVar10;
        fVar11 = auVar45._12_4_;
        auVar67._12_4_ = auVar59._12_4_ + fVar11;
        auVar95._0_4_ = auVar66._0_4_ * auVar62._0_4_;
        auVar95._4_4_ = auVar66._4_4_ * auVar62._4_4_;
        auVar95._8_4_ = auVar66._8_4_ * auVar62._8_4_;
        auVar95._12_4_ = auVar66._12_4_ * auVar62._12_4_;
        auVar94 = vfmsub231ps_fma(auVar95,auVar91,auVar67);
        auVar68._0_4_ = auVar67._0_4_ * auVar75._0_4_;
        auVar68._4_4_ = auVar67._4_4_ * auVar75._4_4_;
        auVar68._8_4_ = auVar67._8_4_ * auVar75._8_4_;
        auVar68._12_4_ = auVar67._12_4_ * auVar75._12_4_;
        auVar67 = vfmsub231ps_fma(auVar68,auVar66,auVar46);
        auVar47._0_4_ = auVar91._0_4_ * auVar46._0_4_;
        auVar47._4_4_ = auVar91._4_4_ * auVar46._4_4_;
        auVar47._8_4_ = auVar91._8_4_ * auVar46._8_4_;
        auVar47._12_4_ = auVar91._12_4_ * auVar46._12_4_;
        auVar46 = vfmsub231ps_fma(auVar47,auVar75,auVar62);
        fVar3 = *(float *)(ray + k * 4 + 0x60);
        auVar90._0_4_ = auVar46._0_4_ * fVar3;
        auVar90._4_4_ = auVar46._4_4_ * fVar3;
        auVar90._8_4_ = auVar46._8_4_ * fVar3;
        auVar90._12_4_ = auVar46._12_4_ * fVar3;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar93._4_4_ = uVar1;
        auVar93._0_4_ = uVar1;
        auVar93._8_4_ = uVar1;
        auVar93._12_4_ = uVar1;
        auVar67 = vfmadd231ps_fma(auVar90,auVar93,auVar67);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar97._4_4_ = uVar1;
        auVar97._0_4_ = uVar1;
        auVar97._8_4_ = uVar1;
        auVar97._12_4_ = uVar1;
        auVar62 = vfmadd231ps_fma(auVar67,auVar97,auVar94);
        auVar67 = vsubps_avx(auVar82,auVar58);
        auVar94 = vsubps_avx(auVar45,auVar52);
        auVar63._0_4_ = auVar82._0_4_ + auVar58._0_4_;
        auVar63._4_4_ = auVar82._4_4_ + auVar58._4_4_;
        auVar63._8_4_ = auVar82._8_4_ + auVar58._8_4_;
        auVar63._12_4_ = auVar82._12_4_ + auVar58._12_4_;
        auVar45._0_4_ = fVar8 + auVar52._0_4_;
        auVar45._4_4_ = fVar9 + auVar52._4_4_;
        auVar45._8_4_ = fVar10 + auVar52._8_4_;
        auVar45._12_4_ = fVar11 + auVar52._12_4_;
        fVar12 = auVar94._0_4_;
        auVar77._0_4_ = auVar63._0_4_ * fVar12;
        fVar15 = auVar94._4_4_;
        auVar77._4_4_ = auVar63._4_4_ * fVar15;
        fVar18 = auVar94._8_4_;
        auVar77._8_4_ = auVar63._8_4_ * fVar18;
        fVar21 = auVar94._12_4_;
        auVar77._12_4_ = auVar63._12_4_ * fVar21;
        auVar47 = vfmsub231ps_fma(auVar77,auVar67,auVar45);
        auVar46 = vsubps_avx(auVar65,auVar78);
        fVar13 = auVar46._0_4_;
        auVar69._0_4_ = auVar45._0_4_ * fVar13;
        fVar16 = auVar46._4_4_;
        auVar69._4_4_ = auVar45._4_4_ * fVar16;
        fVar19 = auVar46._8_4_;
        auVar69._8_4_ = auVar45._8_4_ * fVar19;
        fVar22 = auVar46._12_4_;
        auVar69._12_4_ = auVar45._12_4_ * fVar22;
        auVar86._0_4_ = auVar65._0_4_ + auVar78._0_4_;
        auVar86._4_4_ = auVar65._4_4_ + auVar78._4_4_;
        auVar86._8_4_ = auVar65._8_4_ + auVar78._8_4_;
        auVar86._12_4_ = auVar65._12_4_ + auVar78._12_4_;
        auVar45 = vfmsub231ps_fma(auVar69,auVar94,auVar86);
        fVar14 = auVar67._0_4_;
        auVar87._0_4_ = auVar86._0_4_ * fVar14;
        fVar17 = auVar67._4_4_;
        auVar87._4_4_ = auVar86._4_4_ * fVar17;
        fVar20 = auVar67._8_4_;
        auVar87._8_4_ = auVar86._8_4_ * fVar20;
        fVar23 = auVar67._12_4_;
        auVar87._12_4_ = auVar86._12_4_ * fVar23;
        auVar63 = vfmsub231ps_fma(auVar87,auVar46,auVar63);
        auVar64._0_4_ = auVar63._0_4_ * fVar3;
        auVar64._4_4_ = auVar63._4_4_ * fVar3;
        auVar64._8_4_ = auVar63._8_4_ * fVar3;
        auVar64._12_4_ = auVar63._12_4_ * fVar3;
        auVar45 = vfmadd231ps_fma(auVar64,auVar93,auVar45);
        auVar63 = vfmadd231ps_fma(auVar45,auVar97,auVar47);
        auVar47 = vsubps_avx(auVar78,auVar70);
        auVar57._0_4_ = auVar78._0_4_ + auVar70._0_4_;
        auVar57._4_4_ = auVar78._4_4_ + auVar70._4_4_;
        auVar57._8_4_ = auVar78._8_4_ + auVar70._8_4_;
        auVar57._12_4_ = auVar78._12_4_ + auVar70._12_4_;
        auVar70 = vsubps_avx(auVar58,auVar71);
        auVar51._0_4_ = auVar58._0_4_ + auVar71._0_4_;
        auVar51._4_4_ = auVar58._4_4_ + auVar71._4_4_;
        auVar51._8_4_ = auVar58._8_4_ + auVar71._8_4_;
        auVar51._12_4_ = auVar58._12_4_ + auVar71._12_4_;
        auVar71 = vsubps_avx(auVar52,auVar59);
        auVar72._0_4_ = auVar52._0_4_ + auVar59._0_4_;
        auVar72._4_4_ = auVar52._4_4_ + auVar59._4_4_;
        auVar72._8_4_ = auVar52._8_4_ + auVar59._8_4_;
        auVar72._12_4_ = auVar52._12_4_ + auVar59._12_4_;
        auVar78._0_4_ = auVar71._0_4_ * auVar51._0_4_;
        auVar78._4_4_ = auVar71._4_4_ * auVar51._4_4_;
        auVar78._8_4_ = auVar71._8_4_ * auVar51._8_4_;
        auVar78._12_4_ = auVar71._12_4_ * auVar51._12_4_;
        auVar78 = vfmsub231ps_fma(auVar78,auVar70,auVar72);
        auVar73._0_4_ = auVar72._0_4_ * auVar47._0_4_;
        auVar73._4_4_ = auVar72._4_4_ * auVar47._4_4_;
        auVar73._8_4_ = auVar72._8_4_ * auVar47._8_4_;
        auVar73._12_4_ = auVar72._12_4_ * auVar47._12_4_;
        auVar45 = vfmsub231ps_fma(auVar73,auVar71,auVar57);
        auVar58._0_4_ = auVar70._0_4_ * auVar57._0_4_;
        auVar58._4_4_ = auVar70._4_4_ * auVar57._4_4_;
        auVar58._8_4_ = auVar70._8_4_ * auVar57._8_4_;
        auVar58._12_4_ = auVar70._12_4_ * auVar57._12_4_;
        auVar58 = vfmsub231ps_fma(auVar58,auVar47,auVar51);
        auVar52._0_4_ = auVar58._0_4_ * fVar3;
        auVar52._4_4_ = auVar58._4_4_ * fVar3;
        auVar52._8_4_ = auVar58._8_4_ * fVar3;
        auVar52._12_4_ = auVar58._12_4_ * fVar3;
        auVar45 = vfmadd231ps_fma(auVar52,auVar93,auVar45);
        auVar52 = vfmadd231ps_fma(auVar45,auVar97,auVar78);
        auVar84._0_4_ = auVar52._0_4_ + auVar62._0_4_ + auVar63._0_4_;
        auVar84._4_4_ = auVar52._4_4_ + auVar62._4_4_ + auVar63._4_4_;
        auVar84._8_4_ = auVar52._8_4_ + auVar62._8_4_ + auVar63._8_4_;
        auVar84._12_4_ = auVar52._12_4_ + auVar62._12_4_ + auVar63._12_4_;
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar45 = vminps_avx(auVar62,auVar63);
        auVar78 = vminps_avx(auVar45,auVar52);
        auVar45 = vandps_avx(auVar84,auVar59);
        auVar88._0_4_ = auVar45._0_4_ * 1.1920929e-07;
        auVar88._4_4_ = auVar45._4_4_ * 1.1920929e-07;
        auVar88._8_4_ = auVar45._8_4_ * 1.1920929e-07;
        auVar88._12_4_ = auVar45._12_4_ * 1.1920929e-07;
        uVar36 = CONCAT44(auVar88._4_4_,auVar88._0_4_);
        auVar79._0_8_ = uVar36 ^ 0x8000000080000000;
        auVar79._8_4_ = -auVar88._8_4_;
        auVar79._12_4_ = -auVar88._12_4_;
        auVar78 = vcmpps_avx(auVar78,auVar79,5);
        auVar58 = vmaxps_avx(auVar62,auVar63);
        auVar58 = vmaxps_avx(auVar58,auVar52);
        auVar58 = vcmpps_avx(auVar58,auVar88,2);
        auVar78 = vorps_avx(auVar78,auVar58);
        if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar78[0xf] < '\0') {
          auVar53._0_4_ = auVar66._0_4_ * fVar14;
          auVar53._4_4_ = auVar66._4_4_ * fVar17;
          auVar53._8_4_ = auVar66._8_4_ * fVar20;
          auVar53._12_4_ = auVar66._12_4_ * fVar23;
          auVar74._0_4_ = fVar13 * auVar91._0_4_;
          auVar74._4_4_ = fVar16 * auVar91._4_4_;
          auVar74._8_4_ = fVar19 * auVar91._8_4_;
          auVar74._12_4_ = fVar22 * auVar91._12_4_;
          auVar91 = vfmsub213ps_fma(auVar91,auVar94,auVar53);
          auVar80._0_4_ = auVar70._0_4_ * fVar12;
          auVar80._4_4_ = auVar70._4_4_ * fVar15;
          auVar80._8_4_ = auVar70._8_4_ * fVar18;
          auVar80._12_4_ = auVar70._12_4_ * fVar21;
          auVar89._0_4_ = fVar13 * auVar71._0_4_;
          auVar89._4_4_ = fVar16 * auVar71._4_4_;
          auVar89._8_4_ = fVar19 * auVar71._8_4_;
          auVar89._12_4_ = fVar22 * auVar71._12_4_;
          auVar71 = vfmsub213ps_fma(auVar71,auVar67,auVar80);
          auVar58 = vandps_avx(auVar53,auVar59);
          auVar52 = vandps_avx(auVar80,auVar59);
          auVar58 = vcmpps_avx(auVar58,auVar52,1);
          local_13f8 = vblendvps_avx(auVar71,auVar91,auVar58);
          auVar81._0_4_ = auVar47._0_4_ * fVar14;
          auVar81._4_4_ = auVar47._4_4_ * fVar17;
          auVar81._8_4_ = auVar47._8_4_ * fVar20;
          auVar81._12_4_ = auVar47._12_4_ * fVar23;
          auVar71 = vfmsub213ps_fma(auVar47,auVar94,auVar89);
          auVar54._0_4_ = auVar75._0_4_ * fVar12;
          auVar54._4_4_ = auVar75._4_4_ * fVar15;
          auVar54._8_4_ = auVar75._8_4_ * fVar18;
          auVar54._12_4_ = auVar75._12_4_ * fVar21;
          auVar91 = vfmsub213ps_fma(auVar66,auVar46,auVar54);
          auVar58 = vandps_avx(auVar54,auVar59);
          auVar52 = vandps_avx(auVar89,auVar59);
          auVar58 = vcmpps_avx(auVar58,auVar52,1);
          local_13e8 = vblendvps_avx(auVar71,auVar91,auVar58);
          auVar71 = vfmsub213ps_fma(auVar75,auVar67,auVar74);
          auVar70 = vfmsub213ps_fma(auVar70,auVar46,auVar81);
          auVar58 = vandps_avx(auVar74,auVar59);
          auVar52 = vandps_avx(auVar81,auVar59);
          auVar58 = vcmpps_avx(auVar58,auVar52,1);
          local_13d8 = vblendvps_avx(auVar70,auVar71,auVar58);
          auVar70._0_4_ = local_13d8._0_4_ * fVar3;
          auVar70._4_4_ = local_13d8._4_4_ * fVar3;
          auVar70._8_4_ = local_13d8._8_4_ * fVar3;
          auVar70._12_4_ = local_13d8._12_4_ * fVar3;
          auVar58 = vfmadd213ps_fma(auVar93,local_13e8,auVar70);
          auVar58 = vfmadd213ps_fma(auVar97,local_13f8,auVar58);
          auVar75._0_4_ = auVar58._0_4_ + auVar58._0_4_;
          auVar75._4_4_ = auVar58._4_4_ + auVar58._4_4_;
          auVar75._8_4_ = auVar58._8_4_ + auVar58._8_4_;
          auVar75._12_4_ = auVar58._12_4_ + auVar58._12_4_;
          auVar71._0_4_ = local_13d8._0_4_ * fVar8;
          auVar71._4_4_ = local_13d8._4_4_ * fVar9;
          auVar71._8_4_ = local_13d8._8_4_ * fVar10;
          auVar71._12_4_ = local_13d8._12_4_ * fVar11;
          auVar58 = vfmadd213ps_fma(auVar82,local_13e8,auVar71);
          auVar65 = vfmadd213ps_fma(auVar65,local_13f8,auVar58);
          auVar58 = vrcpps_avx(auVar75);
          auVar91._8_4_ = 0x3f800000;
          auVar91._0_8_ = 0x3f8000003f800000;
          auVar91._12_4_ = 0x3f800000;
          auVar82 = vfnmadd213ps_fma(auVar58,auVar75,auVar91);
          auVar58 = vfmadd132ps_fma(auVar82,auVar58,auVar58);
          local_1408._0_4_ = auVar58._0_4_ * (auVar65._0_4_ + auVar65._0_4_);
          local_1408._4_4_ = auVar58._4_4_ * (auVar65._4_4_ + auVar65._4_4_);
          local_1408._8_4_ = auVar58._8_4_ * (auVar65._8_4_ + auVar65._8_4_);
          local_1408._12_4_ = auVar58._12_4_ * (auVar65._12_4_ + auVar65._12_4_);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar82._4_4_ = uVar1;
          auVar82._0_4_ = uVar1;
          auVar82._8_4_ = uVar1;
          auVar82._12_4_ = uVar1;
          auVar58 = vcmpps_avx(auVar82,local_1408,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar92._4_4_ = uVar1;
          auVar92._0_4_ = uVar1;
          auVar92._8_4_ = uVar1;
          auVar92._12_4_ = uVar1;
          auVar76 = ZEXT1664(auVar92);
          auVar65 = vcmpps_avx(local_1408,auVar92,2);
          auVar58 = vandps_avx(auVar65,auVar58);
          auVar65 = auVar78 & auVar58;
          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar65[0xf] < '\0') {
            auVar78 = vandps_avx(auVar78,auVar58);
            auVar58 = vcmpps_avx(auVar75,_DAT_01f7aa10,4);
            auVar78 = vandps_avx(auVar78,auVar58);
            uVar37 = vmovmskps_avx(auVar78);
            if (uVar37 != 0) {
              pSVar5 = context->scene;
              auVar78 = vrcpps_avx(auVar84);
              auVar60._8_4_ = 0x3f800000;
              auVar60._0_8_ = 0x3f8000003f800000;
              auVar60._12_4_ = 0x3f800000;
              auVar58 = vfnmadd213ps_fma(auVar84,auVar78,auVar60);
              auVar78 = vfmadd132ps_fma(auVar58,auVar78,auVar78);
              auVar55._8_4_ = 0x219392ef;
              auVar55._0_8_ = 0x219392ef219392ef;
              auVar55._12_4_ = 0x219392ef;
              auVar45 = vcmpps_avx(auVar45,auVar55,5);
              auVar45 = vandps_avx(auVar45,auVar78);
              auVar48._0_4_ = auVar62._0_4_ * auVar45._0_4_;
              auVar48._4_4_ = auVar62._4_4_ * auVar45._4_4_;
              auVar48._8_4_ = auVar62._8_4_ * auVar45._8_4_;
              auVar48._12_4_ = auVar62._12_4_ * auVar45._12_4_;
              local_1428 = vminps_avx(auVar48,auVar60);
              auVar49._0_4_ = auVar45._0_4_ * auVar63._0_4_;
              auVar49._4_4_ = auVar45._4_4_ * auVar63._4_4_;
              auVar49._8_4_ = auVar45._8_4_ * auVar63._8_4_;
              auVar49._12_4_ = auVar45._12_4_ * auVar63._12_4_;
              local_1418 = vminps_avx(auVar49,auVar60);
              uVar36 = (ulong)(uVar37 & 0xff);
              do {
                uVar28 = 0;
                for (uVar38 = uVar36; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
                {
                  uVar28 = uVar28 + 1;
                }
                uVar37 = *(uint *)(lVar34 + uVar33 + 0x120 + uVar28 * 4);
                pGVar6 = (pSVar5->geometries).items[uVar37].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005d1699:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar44;
                  }
                  uVar38 = (ulong)(uint)((int)uVar28 * 4);
                  local_1398 = *(undefined4 *)(local_1428 + uVar38);
                  uVar1 = *(undefined4 *)(local_1418 + uVar38);
                  local_1388._4_4_ = uVar1;
                  local_1388._0_4_ = uVar1;
                  local_1388._8_4_ = uVar1;
                  local_1388._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar38);
                  args.context = context->user;
                  local_1368._4_4_ = uVar37;
                  local_1368._0_4_ = uVar37;
                  local_1368._8_4_ = uVar37;
                  local_1368._12_4_ = uVar37;
                  uVar1 = *(undefined4 *)(lVar34 + uVar33 + 0x130 + uVar38);
                  local_1378._4_4_ = uVar1;
                  local_1378._0_4_ = uVar1;
                  local_1378._8_4_ = uVar1;
                  local_1378._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_13f8 + uVar38);
                  uVar4 = *(undefined4 *)(local_13e8 + uVar38);
                  local_13b8._4_4_ = uVar4;
                  local_13b8._0_4_ = uVar4;
                  local_13b8._8_4_ = uVar4;
                  local_13b8._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_13d8 + uVar38);
                  local_13a8._4_4_ = uVar4;
                  local_13a8._0_4_ = uVar4;
                  local_13a8._8_4_ = uVar4;
                  local_13a8._12_4_ = uVar4;
                  local_13c8[0] = (RTCHitN)(char)uVar1;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar1;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar1;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar1;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1548 = *local_1528;
                  args.valid = (int *)local_1548;
                  args.geometryUserPtr = pGVar6->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar45 = auVar76._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->occlusionFilterN)(&args);
                    auVar76 = ZEXT1664(auVar45);
                  }
                  if (local_1548 == (undefined1  [16])0x0) {
                    auVar45 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar45 = auVar45 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&args);
                      auVar76 = ZEXT1664(auVar45);
                    }
                    auVar78 = vpcmpeqd_avx(local_1548,_DAT_01f7aa10);
                    auVar45 = auVar78 ^ _DAT_01f7ae20;
                    auVar61._8_4_ = 0xff800000;
                    auVar61._0_8_ = 0xff800000ff800000;
                    auVar61._12_4_ = 0xff800000;
                    auVar78 = vblendvps_avx(auVar61,*(undefined1 (*) [16])(args.ray + 0x80),auVar78)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar78;
                  }
                  auVar56._8_8_ = 0x100000001;
                  auVar56._0_8_ = 0x100000001;
                  if ((auVar56 & auVar45) != (undefined1  [16])0x0) goto LAB_005d1699;
                  *(int *)(ray + k * 4 + 0x80) = auVar76._0_4_;
                }
                uVar36 = uVar36 ^ 1L << (uVar28 & 0x3f);
              } while (uVar36 != 0);
            }
          }
        }
        local_1530 = local_1530 + 1;
        auVar76 = ZEXT3264(local_11f8);
        auVar83 = ZEXT3264(local_1218);
        auVar85 = ZEXT3264(local_1238);
        auVar98 = ZEXT3264(local_1318);
        auVar99 = ZEXT3264(local_1338);
      } while (local_1530 != local_1520);
    }
LAB_005d1683:
    bVar44 = pNVar39 != stack;
    if (!bVar44) {
      return bVar44;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }